

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_io.cpp
# Opt level: O3

void LoadEXR_RGB(float **rgb,int *width,int *height,char *filename)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  float *rgba;
  float *local_30;
  
  LoadEXR_RGBA(&local_30,width,height,filename);
  iVar6 = (int)((long)*height * (long)*width);
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar6) {
    uVar5 = (long)*height * (long)*width * 0xc;
  }
  pfVar2 = (float *)operator_new__(uVar5);
  *rgb = pfVar2;
  if (0 < iVar6) {
    lVar3 = 0;
    lVar4 = 0;
    pfVar2 = local_30;
    do {
      pfVar1 = *rgb;
      *(float *)((long)pfVar1 + lVar3 + 8) = pfVar2[2];
      *(undefined8 *)((long)pfVar1 + lVar3) = *(undefined8 *)pfVar2;
      lVar4 = lVar4 + 1;
      pfVar2 = pfVar2 + 4;
      lVar3 = lVar3 + 0xc;
    } while (lVar4 < (long)*height * (long)*width);
  }
  free(local_30);
  return;
}

Assistant:

void LoadEXR_RGB(float** rgb, int* width, int* height, const char* filename)
{
  float* rgba;
  LoadEXR_RGBA(&rgba, width, height, filename);
  *rgb = new float[(*width)*(*height)*3];
  for (int i=0; i<(*width)*(*height); ++i) {
    memcpy(*rgb + 3*i, rgba + 4*i, 3 * sizeof(float));
  }
  free(rgba);
}